

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

string * __thiscall
phosg::format_data_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,iovec *iovs,size_t num_iovs,
          uint64_t start_address,iovec *prev_iovs,size_t num_prev_iovs,uint64_t flags)

{
  StringWriter w;
  _Alloc_hider local_78;
  size_type local_70;
  char local_68;
  undefined7 uStack_67;
  undefined8 uStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_78._M_p = &local_68;
  local_70 = 0;
  local_68 = '\0';
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = StringWriter::write;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(_Alloc_hider **)((long)local_58._M_unused._0_8_ + 0x10) = &local_78;
  pcStack_40 = ::std::
               _Function_handler<void_(const_void_*,_unsigned_long),_std::_Bind<void_(phosg::StringWriter::*(phosg::StringWriter_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_void_*,_unsigned_long)>_>
               ::_M_invoke;
  local_48 = ::std::
             _Function_handler<void_(const_void_*,_unsigned_long),_std::_Bind<void_(phosg::StringWriter::*(phosg::StringWriter_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_void_*,_unsigned_long)>_>
             ::_M_manager;
  format_data((function<void_(const_void_*,_unsigned_long)> *)&local_58,(iovec *)this,(size_t)iovs,
              num_iovs,(iovec *)start_address,(size_t)prev_iovs,num_prev_iovs);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_78._M_p == &local_68) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_67,local_68);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_60;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_78._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_67,local_68);
  }
  __return_storage_ptr__->_M_string_length = local_70;
  return __return_storage_ptr__;
}

Assistant:

string format_data(
    const struct iovec* iovs,
    size_t num_iovs,
    uint64_t start_address,
    const struct iovec* prev_iovs,
    size_t num_prev_iovs,
    uint64_t flags) {
  StringWriter w;
  // StringWriter::write is overloaded, so we have to static_cast here to
  // specify which variant should be used
  auto write_data = bind(
      static_cast<void (StringWriter::*)(const void*, size_t)>(&StringWriter::write),
      &w, placeholders::_1, placeholders::_2);
  format_data(write_data, iovs, num_iovs, start_address, prev_iovs, num_prev_iovs, flags);
  return std::move(w.str());
}